

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

Texture3DView
vkt::BindingModel::anon_unknown_1::ImageSampleInstanceImages::getRef3DView
          (TextureLevelPyramid *source,deUint32 baseMipLevel,deUint32 baseArraySlice,
          vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
          *levelStorage)

{
  uint uVar1;
  ConstPixelBufferAccess *__x;
  size_type sVar2;
  reference levels;
  Texture3DView TVar3;
  uint local_38;
  deUint32 level;
  deUint32 numLevels;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
  *levelStorage_local;
  deUint32 baseArraySlice_local;
  deUint32 baseMipLevel_local;
  TextureLevelPyramid *source_local;
  ConstPixelBufferAccess *local_10;
  
  uVar1 = tcu::TextureLevelPyramid::getNumLevels(source);
  for (local_38 = baseMipLevel; local_38 < uVar1; local_38 = local_38 + 1) {
    __x = tcu::TextureLevelPyramid::getLevel(source,local_38);
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
    push_back(levelStorage,__x);
  }
  sVar2 = std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
          size(levelStorage);
  levels = std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
           front(levelStorage);
  tcu::Texture3DView::Texture3DView((Texture3DView *)&source_local,(int)sVar2,levels);
  TVar3._4_4_ = 0;
  TVar3.m_numLevels = (uint)source_local;
  TVar3.m_levels = local_10;
  return TVar3;
}

Assistant:

tcu::Texture3DView ImageSampleInstanceImages::getRef3DView (const tcu::TextureLevelPyramid& source, deUint32 baseMipLevel, deUint32 baseArraySlice, std::vector<tcu::ConstPixelBufferAccess>* levelStorage)
{
	DE_ASSERT(levelStorage->empty());
	DE_ASSERT(baseArraySlice == 0);
	DE_UNREF(baseArraySlice);

	const deUint32 numLevels = (deUint32)source.getNumLevels();

	// cut pyramid from baseMipLevel
	for (deUint32 level = baseMipLevel; level < numLevels; ++level)
		levelStorage->push_back(source.getLevel(level));

	return tcu::Texture3DView((int)levelStorage->size(), &levelStorage->front());
}